

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O3

bool iDynTree::dynamicsEstimationForwardVelAccKinematics
               (Model *param_1,Traversal *traversal,Vector3 *base_classicalProperAcc,
               Vector3 *base_angularVel,Vector3 *base_angularAcc,JointPosDoubleArray *jointPos,
               JointDOFsDoubleArray *jointVel,JointDOFsDoubleArray *jointAcc,LinkVelArray *linkVel,
               LinkAccArray *linkProperAcc)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  double *pdVar8;
  ulong uVar9;
  AngularMotionVector3 angAcc;
  LinearMotionVector3 linProAcc;
  AngularMotionVector3 angVel;
  
  iVar1 = iDynTree::Traversal::getNrOfVisitedLinks();
  if (iVar1 != 0) {
    uVar9 = 0;
    do {
      iDynTree::Traversal::getLink((long)traversal);
      lVar3 = iDynTree::Traversal::getParentLink((long)traversal);
      plVar4 = (long *)iDynTree::Traversal::getParentJoint((long)traversal);
      lVar5 = iDynTree::Link::getIndex();
      if (lVar3 == 0) {
        puVar7 = (undefined8 *)iDynTree::LinkVelArray::operator()(linkVel,lVar5);
        *puVar7 = 0;
        puVar7[1] = 0;
        puVar7[2] = 0;
        iDynTree::GeomVector3::GeomVector3(&angVel,base_angularVel->m_data,3);
        lVar3 = iDynTree::Link::getIndex();
        lVar3 = iDynTree::LinkVelArray::operator()(linkVel,lVar3);
        *(double *)(lVar3 + 0x18) = angVel.super_Vector3.m_data[0];
        *(double *)(lVar3 + 0x20) = angVel.super_Vector3.m_data[1];
        *(double *)(lVar3 + 0x28) = angVel.super_Vector3.m_data[2];
        iDynTree::GeomVector3::GeomVector3(&linProAcc,base_classicalProperAcc->m_data,3);
        lVar3 = iDynTree::Link::getIndex();
        pdVar8 = (double *)iDynTree::LinkAccArray::operator()(linkProperAcc,lVar3);
        *pdVar8 = linProAcc.super_Vector3.m_data[0];
        pdVar8[1] = linProAcc.super_Vector3.m_data[1];
        pdVar8[2] = linProAcc.super_Vector3.m_data[2];
        iDynTree::GeomVector3::GeomVector3(&angAcc,base_angularAcc->m_data,3);
        lVar3 = iDynTree::Link::getIndex();
        lVar3 = iDynTree::LinkAccArray::operator()(linkProperAcc,lVar3);
        *(double *)(lVar3 + 0x18) = angAcc.super_Vector3.m_data[0];
        *(double *)(lVar3 + 0x20) = angAcc.super_Vector3.m_data[1];
        *(double *)(lVar3 + 0x28) = angAcc.super_Vector3.m_data[2];
      }
      else {
        uVar6 = iDynTree::Link::getIndex();
        (**(code **)(*plVar4 + 0x70))
                  (plVar4,jointPos,jointVel,jointAcc,linkVel,linkProperAcc,lVar5,uVar6);
      }
      uVar9 = uVar9 + 1;
      uVar2 = iDynTree::Traversal::getNrOfVisitedLinks();
    } while (uVar9 < uVar2);
  }
  return true;
}

Assistant:

bool dynamicsEstimationForwardVelAccKinematics(const iDynTree::Model & /*model*/,
                                               const iDynTree::Traversal & traversal,
                                               const Vector3 & base_classicalProperAcc,
                                               const Vector3 & base_angularVel,
                                               const Vector3 & base_angularAcc,
                                               const iDynTree::JointPosDoubleArray & jointPos,
                                               const iDynTree::JointDOFsDoubleArray & jointVel,
                                               const iDynTree::JointDOFsDoubleArray & jointAcc,
                                                     iDynTree::LinkVelArray & linkVel,
                                                     iDynTree::LinkAccArray  & linkProperAcc)
{
    bool retValue = true;

    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        if( parentLink == 0 )
        {
            // If the visited link is the base, we can set the base velocity and proper acceleration
            // from the input base information

            // the dynamics is invariant to a linear velocity offset, so we can put an arbitrary
            // value for the linear part of the twist: we choose to set it to zero for convenience,
            // but please note that this **does not** mean that we are assuming that the body
            // has a zero velocity with respect to a earth-fixed frame
            LinearMotionVector3 linVel;
            linVel.zero();
            linkVel(visitedLink->getIndex()).setLinearVec3(linVel);

            // We have the input angular velocity
            AngularMotionVector3 angVel(base_angularVel.data(),3);
            linkVel(visitedLink->getIndex()).setAngularVec3(angVel);

            // We don't need to convert the proper classical acceleration
            // in spatial classical acceleration because the difference between
            // the two depends linearly on the linear part of the link velocity,
            // that we choose to be zero
            LinearMotionVector3 linProAcc(base_classicalProperAcc.data(),3);
            linkProperAcc(visitedLink->getIndex()).setLinearVec3(linProAcc);
            AngularMotionVector3 angAcc(base_angularAcc.data(),3);
            linkProperAcc(visitedLink->getIndex()).setAngularVec3(angAcc);
        }
        else
        {
            // Otherwise we compute the child velocity and acceleration from parent
            toParentJoint->computeChildVelAcc(jointPos,
                                              jointVel,
                                              jointAcc,
                                              linkVel,
                                              linkProperAcc,
                                              visitedLink->getIndex(),parentLink->getIndex());
        }

    }

    return retValue;

}